

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O0

int Curl_timestrcmp(char *a,char *b)

{
  bool local_29;
  int local_28;
  uint local_24;
  int i;
  int match;
  char *b_local;
  char *a_local;
  
  local_24 = 0;
  local_28 = 0;
  if ((a == (char *)0x0) || (b == (char *)0x0)) {
    local_29 = a != (char *)0x0 || b != (char *)0x0;
    a_local._4_4_ = (uint)local_29;
  }
  else {
    for (; (local_24 = (int)(char)(a[local_28] ^ b[local_28]) | local_24, a_local._4_4_ = local_24,
           a[local_28] != '\0' && (b[local_28] != '\0')); local_28 = local_28 + 1) {
    }
  }
  return a_local._4_4_;
}

Assistant:

int Curl_timestrcmp(const char *a, const char *b)
{
  int match = 0;
  int i = 0;

  if(a && b) {
    while(1) {
      match |= a[i]^b[i];
      if(!a[i] || !b[i])
        break;
      i++;
    }
  }
  else
    return a || b;
  return match;
}